

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

bool __thiscall FpgaIO::ReadFirewirePhy(FpgaIO *this,uchar addr,uchar *data)

{
  BasePort *pBVar1;
  int iVar2;
  ulong uVar3;
  undefined7 in_register_00000031;
  char *pcVar4;
  ostream *poVar5;
  quadlet_t read_data;
  
  uVar3 = CONCAT71(in_register_00000031,addr) & 0xffffffff;
  if ((byte)uVar3 < 0x10) {
    read_data = 0;
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,(ulong)(this->super_BoardIO).BoardId,1,uVar3);
    if ((char)iVar2 == '\0') {
      return false;
    }
    pBVar1 = (this->super_BoardIO).port;
    iVar2 = (*pBVar1->_vptr_BasePort[0x23])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,2,&read_data);
    if ((char)iVar2 == '\0') {
      return false;
    }
    if ((read_data >> 8 & 0xf) == (uint)CONCAT71(in_register_00000031,addr)) {
      *data = (uchar)read_data;
      return true;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"ReadFirewirePhy: read addr ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    pcVar4 = ", expected ";
  }
  else {
    poVar5 = (ostream *)&std::cout;
    pcVar4 = "ReadFirewirePhy: invalid addr ";
  }
  poVar5 = std::operator<<(poVar5,pcVar4);
  poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  return false;
}

Assistant:

bool FpgaIO::ReadFirewirePhy(unsigned char addr, unsigned char &data)
{
    if (addr > 15) {
        std::cout << "ReadFirewirePhy: invalid addr "
                  << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    quadlet_t write_data = addr;
    quadlet_t read_data = 0;
    if (!port->WriteQuadlet(BoardId, BoardIO::FW_PHY_REQ, write_data))
        return false;
    if (!port->ReadQuadlet(BoardId, BoardIO::FW_PHY_RESP, read_data))
        return false;
    // Register address in read response is bits 11-8
    unsigned char read_addr = static_cast<unsigned char>(read_data>>8) & 0x0f;
    // Check that it matches the request address
    if (read_addr != addr) {
        std::cout << "ReadFirewirePhy: read addr " << static_cast<unsigned int>(read_addr)
                  << ", expected " << static_cast<unsigned int>(addr) << std::endl;
        return false;
    }
    data = static_cast<unsigned char>(read_data);
    return true;
}